

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

unsigned_long * __thiscall
pbrt::
HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::operator[](HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
             *this,LightHandle *key)

{
  bool bVar1;
  size_t index;
  const_reference this_00;
  pair<pbrt::LightHandle,_unsigned_long> *ppVar2;
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  *in_RDI;
  size_t offset;
  LightHandle *in_stack_00000028;
  undefined4 in_stack_00000030;
  int in_stack_00000034;
  char *in_stack_00000038;
  LogLevel in_stack_00000044;
  
  index = FindOffset((HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
                      *)CONCAT44(in_stack_00000034,in_stack_00000030),in_stack_00000028);
  this_00 = pstd::
            vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
            ::operator[](in_RDI,index);
  bVar1 = pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>::has_value(this_00);
  if (!bVar1) {
    LogFatal<char_const(&)[26]>
              (in_stack_00000044,in_stack_00000038,in_stack_00000034,(char *)in_stack_00000028,
               (char (*) [26])this);
  }
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::operator[](in_RDI,index);
  ppVar2 = pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>::operator->
                     ((optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)0x7f1e1d);
  return &ppVar2->second;
}

Assistant:

PBRT_CPU_GPU
    const Value &operator[](const Key &key) const {
        size_t offset = FindOffset(key);
        CHECK(table[offset].has_value());
        return table[offset]->second;
    }